

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZipReader.cpp
# Opt level: O0

IReadFile * __thiscall irr::io::CZipReader::createAndOpenFile(CZipReader *this,u32 index)

{
  uint uVar1;
  SFileListEntry *pSVar2;
  char *pcVar3;
  long in_RDI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  s32 err;
  z_stream stream;
  u8 *pcData;
  c8 *pBuf;
  u32 uncompressedSize;
  u32 decryptedSize;
  u8 *decryptedBuf;
  IReadFile *decrypted;
  s16 actualCompressionMethod;
  char buf [64];
  SZipFileEntry *e;
  undefined4 in_stack_fffffffffffffe88;
  u32 in_stack_fffffffffffffe8c;
  array<irr::io::SFileListEntry> *in_stack_fffffffffffffe90;
  array<irr::io::SFileListEntry> *this_00;
  IReadFile *in_stack_fffffffffffffe98;
  long *plVar4;
  path *in_stack_fffffffffffffea0;
  void *pvVar5;
  int local_10c;
  void *local_108;
  uint local_100;
  void *local_f0;
  uint local_e8;
  undefined8 local_c8;
  undefined8 local_c0;
  void *local_98;
  void *local_90;
  uint local_88;
  u32 local_84;
  void *local_80;
  long local_78;
  short local_6a;
  array<irr::io::SFileListEntry> local_68 [2];
  SZipFileEntry *local_20;
  IReadFile *local_8;
  
  core::array<irr::io::SFileListEntry>::operator[]
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  local_20 = core::array<irr::io::SZipFileEntry>::operator[]
                       ((array<irr::io::SZipFileEntry> *)in_stack_fffffffffffffe90,
                        in_stack_fffffffffffffe8c);
  local_6a = (local_20->header).CompressionMethod;
  local_78 = 0;
  local_80 = (void *)0x0;
  local_84 = (local_20->header).DataDescriptor.CompressedSize;
  if (local_6a == 0) {
    core::array<irr::io::SFileListEntry>::operator[]
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    local_8 = createLimitReadFile(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                  (long)in_stack_fffffffffffffe90,
                                  CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  else if (local_6a == 8) {
    local_88 = (local_20->header).DataDescriptor.UncompressedSize;
    local_90 = operator_new__((ulong)local_88);
    if (local_90 == (void *)0x0) {
      core::array<irr::io::SFileListEntry>::operator[]
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      pcVar3 = core::string<char>::c_str((string<char> *)0x388c19);
      snprintf((char *)local_68,0x40,"Not enough memory for decompressing %s",pcVar3);
      os::Printer::log((Printer *)local_68,__x_00);
      if (local_78 != 0) {
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      local_8 = (IReadFile *)0x0;
    }
    else {
      local_98 = local_80;
      if (local_80 == (void *)0x0) {
        local_98 = operator_new__((ulong)local_84);
        if (local_98 == (void *)0x0) {
          core::array<irr::io::SFileListEntry>::operator[]
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
          pcVar3 = core::string<char>::c_str((string<char> *)0x388cef);
          snprintf((char *)local_68,0x40,"Not enough memory for decompressing %s",pcVar3);
          os::Printer::log((Printer *)local_68,__x_01);
          if (local_90 != (void *)0x0) {
            operator_delete__(local_90);
          }
          return (IReadFile *)0x0;
        }
        (**(code **)(**(long **)(in_RDI + 0x10) + 8))
                  (*(long **)(in_RDI + 0x10),(long)local_20->Offset,0);
        (**(code **)**(undefined8 **)(in_RDI + 0x10))
                  (*(undefined8 **)(in_RDI + 0x10),local_98,local_84);
      }
      local_108 = local_98;
      local_100 = local_84;
      local_f0 = local_90;
      local_e8 = local_88;
      local_c8 = 0;
      local_c0 = 0;
      local_10c = inflateInit2_(&local_108,0xfffffff1,"1.2.11",0x70);
      if (local_10c == 0) {
        inflate(&local_108,4);
        inflateEnd(&local_108);
        local_10c = 0;
        inflateEnd(&local_108);
      }
      if (local_78 == 0) {
        if (local_98 != (void *)0x0) {
          operator_delete__(local_98);
        }
      }
      else {
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      uVar1 = local_88;
      if (local_10c == 0) {
        plVar4 = *(long **)(in_RDI + 8);
        pvVar5 = local_90;
        pSVar2 = core::array<irr::io::SFileListEntry>::operator[]
                           (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
        local_8 = (IReadFile *)(**(code **)(*plVar4 + 8))(plVar4,pvVar5,uVar1,&pSVar2->FullName,1);
      }
      else {
        core::array<irr::io::SFileListEntry>::operator[]
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
        pcVar3 = core::string<char>::c_str((string<char> *)0x388eb7);
        snprintf((char *)local_68,0x40,"Error decompressing %s",pcVar3);
        os::Printer::log((Printer *)local_68,__x_02);
        if (local_90 != (void *)0x0) {
          operator_delete__(local_90);
        }
        local_8 = (IReadFile *)0x0;
      }
    }
  }
  else if (local_6a == 0xc) {
    os::Printer::log((Printer *)"bzip2 decompression not supported. File cannot be read.",__x);
    local_8 = (IReadFile *)0x0;
  }
  else if (local_6a == 0xe) {
    os::Printer::log((Printer *)"lzma decompression not supported. File cannot be read.",__x);
    local_8 = (IReadFile *)0x0;
  }
  else if (local_6a == 99) {
    os::Printer::log((Printer *)"Decryption support not enabled. File cannot be read.",__x);
    local_8 = (IReadFile *)0x0;
  }
  else {
    this_00 = local_68;
    core::array<irr::io::SFileListEntry>::operator[](this_00,in_stack_fffffffffffffe8c);
    pcVar3 = core::string<char>::c_str((string<char> *)0x389015);
    snprintf((char *)this_00,0x40,"file has unsupported compression method. %s",pcVar3);
    os::Printer::log((Printer *)local_68,__x_03);
    local_8 = (IReadFile *)0x0;
  }
  return local_8;
}

Assistant:

IReadFile *CZipReader::createAndOpenFile(u32 index)
{
	// Irrlicht supports 0, 8, 12, 14, 99
	// 0 - The file is stored (no compression)
	// 1 - The file is Shrunk
	// 2 - The file is Reduced with compression factor 1
	// 3 - The file is Reduced with compression factor 2
	// 4 - The file is Reduced with compression factor 3
	// 5 - The file is Reduced with compression factor 4
	// 6 - The file is Imploded
	// 7 - Reserved for Tokenizing compression algorithm
	// 8 - The file is Deflated
	// 9 - Reserved for enhanced Deflating
	// 10 - PKWARE Date Compression Library Imploding
	// 12 - bzip2 - Compression Method from libbz2, WinZip 10
	// 14 - LZMA - Compression Method, WinZip 12
	// 96 - Jpeg compression - Compression Method, WinZip 12
	// 97 - WavPack - Compression Method, WinZip 11
	// 98 - PPMd - Compression Method, WinZip 10
	// 99 - AES encryption, WinZip 9

	const SZipFileEntry &e = FileInfo[Files[index].ID];
	char buf[64];
	s16 actualCompressionMethod = e.header.CompressionMethod;
	IReadFile *decrypted = 0;
	u8 *decryptedBuf = 0;
	u32 decryptedSize = e.header.DataDescriptor.CompressedSize;
	switch (actualCompressionMethod) {
	case 0: // no compression
	{
		if (decrypted)
			return decrypted;
		else
			return createLimitReadFile(Files[index].FullName, File, e.Offset, decryptedSize);
	}
	case 8: {
		const u32 uncompressedSize = e.header.DataDescriptor.UncompressedSize;
		c8 *pBuf = new c8[uncompressedSize];
		if (!pBuf) {
			snprintf_irr(buf, 64, "Not enough memory for decompressing %s", Files[index].FullName.c_str());
			os::Printer::log(buf, ELL_ERROR);
			if (decrypted)
				decrypted->drop();
			return 0;
		}

		u8 *pcData = decryptedBuf;
		if (!pcData) {
			pcData = new u8[decryptedSize];
			if (!pcData) {
				snprintf_irr(buf, 64, "Not enough memory for decompressing %s", Files[index].FullName.c_str());
				os::Printer::log(buf, ELL_ERROR);
				delete[] pBuf;
				return 0;
			}

			// memset(pcData, 0, decryptedSize);
			File->seek(e.Offset);
			File->read(pcData, decryptedSize);
		}

		// Setup the inflate stream.
		z_stream stream;
		s32 err;

		stream.next_in = (Bytef *)pcData;
		stream.avail_in = (uInt)decryptedSize;
		stream.next_out = (Bytef *)pBuf;
		stream.avail_out = uncompressedSize;
		stream.zalloc = (alloc_func)0;
		stream.zfree = (free_func)0;

		// Perform inflation. wbits < 0 indicates no zlib header inside the data.
		err = inflateInit2(&stream, -MAX_WBITS);
		if (err == Z_OK) {
			err = inflate(&stream, Z_FINISH);
			inflateEnd(&stream);
			if (err == Z_STREAM_END)
				err = Z_OK;
			err = Z_OK;
			inflateEnd(&stream);
		}

		if (decrypted)
			decrypted->drop();
		else
			delete[] pcData;

		if (err != Z_OK) {
			snprintf_irr(buf, 64, "Error decompressing %s", Files[index].FullName.c_str());
			os::Printer::log(buf, ELL_ERROR);
			delete[] pBuf;
			return 0;
		} else
			return FileSystem->createMemoryReadFile(pBuf, uncompressedSize, Files[index].FullName, true);
	}
	case 12: {
		os::Printer::log("bzip2 decompression not supported. File cannot be read.", ELL_ERROR);
		return 0;
	}
	case 14: {
		os::Printer::log("lzma decompression not supported. File cannot be read.", ELL_ERROR);
		return 0;
	}
	case 99:
		// If we come here with an encrypted file, decryption support is missing
		os::Printer::log("Decryption support not enabled. File cannot be read.", ELL_ERROR);
		return 0;
	default:
		snprintf_irr(buf, 64, "file has unsupported compression method. %s", Files[index].FullName.c_str());
		os::Printer::log(buf, ELL_ERROR);
		return 0;
	};
}